

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

charcount_t __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::LineLength
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,EncodedCharPtr first,EncodedCharPtr last,
          size_t *cb)

{
  code *pcVar1;
  EncodedCharPtr puVar2;
  bool bVar3;
  OLECHAR OVar4;
  undefined4 *puVar5;
  EncodedCharPtr prev;
  EncodedCharPtr p;
  size_t *psStack_28;
  charcount_t result;
  size_t *cb_local;
  EncodedCharPtr last_local;
  EncodedCharPtr first_local;
  Scanner<UTF8EncodingPolicyBase<false>_> *this_local;
  
  psStack_28 = cb;
  cb_local = (size_t *)last;
  last_local = first;
  first_local = (EncodedCharPtr)this;
  if (cb == (size_t *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,199,"(cb != nullptr)","cb != nullptr");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  p._4_4_ = 0;
  prev = last_local;
  while ((((puVar2 = prev,
           OVar4 = UTF8EncodingPolicyBase<false>::ReadFull<false>
                             (&this->super_UTF8EncodingPolicyBase<false>,&prev,
                              (EncodedCharPtr)cb_local), OVar4 != L'\0' && (OVar4 != L'\n')) &&
          (OVar4 != L'\r')) && (OVar4 != L'\x2028' && OVar4 != L'\x2029'))) {
    p._4_4_ = p._4_4_ + 1;
  }
  if (puVar2 < last_local) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0xdb,"(prev >= first)","prev >= first");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  *psStack_28 = (long)puVar2 - (long)last_local;
  return p._4_4_;
}

Assistant:

charcount_t Scanner<EncodingPolicy>::LineLength(EncodedCharPtr first, EncodedCharPtr last, size_t* cb)
{
    Assert(cb != nullptr);

    charcount_t result = 0;
    EncodedCharPtr p = first;

    for (;;)
    {
        EncodedCharPtr prev = p;
        switch( this->template ReadFull<false>(p, last) )
        {
            case kchNWL: // _C_NWL
            case kchRET:
            case kchLS:
            case kchPS:
            case kchNUL: // _C_NUL
                // p is now advanced past the line terminator character.
                // We need to know the number of bytes making up the line, not including the line terminator character.
                // To avoid subtracting a variable number of bytes because the line terminator characters are different
                // number of bytes long (plus there may be multiple valid encodings for these characters) just keep
                // track of the first byte of the line terminator character in prev.
                Assert(prev >= first);
                *cb = prev - first;
                return result;
        }
        result++;
    }
}